

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

MemberSyntax * __thiscall slang::parsing::Parser::parseLibraryMember(Parser *this)

{
  TokenKind TVar1;
  ConfigDeclarationSyntax *pCVar2;
  LibraryDeclarationSyntax *pLVar3;
  EmptyMemberSyntax *pEVar4;
  FilePathSpecSyntax *filePath;
  Token TVar5;
  Token semi;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_90;
  TokenList local_58;
  
  TVar5 = ParserBase::peek(&this->super_ParserBase);
  TVar1 = TVar5.kind;
  pEVar4 = (EmptyMemberSyntax *)0x0;
  if (TVar1 < IncludeKeyword) {
    if (TVar1 == Semicolon) {
      local_90.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
      local_90.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
      local_90.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
      local_90.super_SyntaxListBase.childCount = 0;
      local_90.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
           (pointer)0x0;
      local_90.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
      _M_extent._M_extent_value = 0;
      local_90.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002f75e8;
      local_58.super_SyntaxListBase.super_SyntaxNode.kind = TokenList;
      local_58.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
      local_58.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
      local_58.super_SyntaxListBase.childCount = 0;
      local_58.super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr = (pointer)0x0;
      local_58.super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent._M_extent_value =
           0;
      local_58.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002f7be8;
      TVar5 = ParserBase::consume(&this->super_ParserBase);
      pEVar4 = syntax::SyntaxFactory::emptyMember(&this->factory,&local_90,&local_58,TVar5);
    }
    else if (TVar1 == ConfigKeyword) {
      pCVar2 = parseConfigDeclaration(this,(AttrList)ZEXT816(0));
      return &pCVar2->super_MemberSyntax;
    }
  }
  else if (TVar1 == IncludeKeyword) {
    TVar5 = ParserBase::consume(&this->super_ParserBase);
    filePath = parseFilePathSpec(this);
    semi = ParserBase::expect(&this->super_ParserBase,Semicolon);
    local_90.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
    local_90.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_90.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_90.super_SyntaxListBase.childCount = 0;
    local_90.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
         (pointer)0x0;
    local_90.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
    _M_extent_value = 0;
    local_90.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002f75e8;
    pEVar4 = (EmptyMemberSyntax *)
             syntax::SyntaxFactory::libraryIncludeStatement
                       (&this->factory,&local_90,TVar5,filePath,semi);
  }
  else if (TVar1 == LibraryKeyword) {
    pLVar3 = parseLibraryDecl(this);
    return &pLVar3->super_MemberSyntax;
  }
  return &pEVar4->super_MemberSyntax;
}

Assistant:

MemberSyntax* Parser::parseLibraryMember() {
    Token token = peek();
    switch (token.kind) {
        case TokenKind::ConfigKeyword:
            return &parseConfigDeclaration({});
        case TokenKind::Semicolon:
            return &factory.emptyMember(nullptr, nullptr, consume());
        case TokenKind::IncludeKeyword: {
            auto keyword = consume();
            auto& path = parseFilePathSpec();
            auto semi = expect(TokenKind::Semicolon);
            return &factory.libraryIncludeStatement(nullptr, keyword, path, semi);
        }
        case TokenKind::LibraryKeyword:
            return &parseLibraryDecl();
        default:
            return nullptr;
    }
}